

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O1

unsigned_long __thiscall
lodepng::ExtractZlib::huffmanDecodeSymbol
          (ExtractZlib *this,uchar *in,size_t *bp,HuffmanTree *tree,size_t inlength)

{
  byte bVar1;
  pointer puVar2;
  ulong in_RAX;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  byte in_R11B;
  ulong uVar6;
  int iVar7;
  
  puVar2 = (tree->tree2d).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (ulong)((long)(tree->tree2d).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2 >> 3) >> 1;
  sVar4 = *bp;
  uVar5 = 0;
  while( true ) {
    if (inlength < sVar4 >> 3 && (sVar4 & 7) == 0) {
      this->error = 10;
      return 0;
    }
    bVar1 = in[sVar4 >> 3];
    *bp = sVar4 + 1;
    iVar7 = 0xb;
    uVar6 = uVar5;
    if (uVar5 < uVar3) {
      in_RAX = puVar2[uVar5 * 2 + (ulong)((bVar1 >> ((uint)sVar4 & 7) & 1) != 0)];
      iVar7 = 0;
      in_R11B = in_RAX < uVar3;
      uVar6 = 0;
      if (!(bool)in_R11B) {
        uVar6 = in_RAX - uVar3;
      }
    }
    this->error = iVar7;
    if (uVar3 <= uVar5) break;
    sVar4 = sVar4 + 1;
    uVar5 = uVar6;
    if ((in_R11B & 1) != 0) {
      return in_RAX;
    }
  }
  return 0;
}

Assistant:

unsigned long huffmanDecodeSymbol(const unsigned char* in, size_t& bp, const HuffmanTree& tree, size_t inlength) {
    //decode a single symbol from given list of bits with given code tree. return value is the symbol
    bool decoded; unsigned long ct;
    for(size_t treepos = 0;;) {
      if((bp & 0x07) == 0 && (bp >> 3) > inlength) { error = 10; return 0; } //error: end reached without endcode
      error = tree.decode(decoded, ct, treepos, readBitFromStream(bp, in));
      if(error) return 0; //stop, an error happened
      if(decoded) return ct;
    }
  }